

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O0

void __thiscall sznet::MinHeap<event>::reserve(MinHeap<event> *this,uint32_t n)

{
  event **ppeVar1;
  uint local_34;
  uint local_24;
  uint32_t capacity;
  event **p;
  uint32_t n_local;
  MinHeap<event> *this_local;
  
  if (this->m_capacity < n) {
    if (this->m_capacity == 0) {
      local_34 = 8;
    }
    else {
      local_34 = this->m_capacity << 1;
    }
    local_24 = local_34;
    if (local_34 < n) {
      local_24 = n;
    }
    ppeVar1 = (event **)realloc(this->m_ptrArr,(ulong)local_24 * 0x18);
    if (ppeVar1 == (event **)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/../../sznet/ds/MinHeap.h"
                    ,0x91,"void sznet::MinHeap<event>::reserve(uint32_t) [T = event]");
    }
    this->m_ptrArr = ppeVar1;
    this->m_capacity = local_24;
  }
  return;
}

Assistant:

void reserve(uint32_t n)
	{
		if (m_capacity < n)
		{
			T** p = nullptr;
			uint32_t capacity = m_capacity ? m_capacity * 2 : 8;
			if (capacity < n)
			{
				capacity = n;
			}
			p = (T**)realloc(m_ptrArr, capacity * (sizeof(T)));
			if (!p)
			{
				assert(0);
			}
			m_ptrArr = p;
			m_capacity = capacity;
		}
	}